

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_help.c
# Opt level: O1

void inithelpscan(scan_ctx *ctx,char *trigger,char *arg,char *endarg)

{
  size_t sVar1;
  
  ctx->trigger = trigger;
  sVar1 = strlen(trigger);
  ctx->tlen = sVar1;
  ctx->arg = arg;
  sVar1 = strlen(arg);
  ctx->flen = sVar1;
  ctx->endarg = endarg;
  sVar1 = strlen(endarg);
  ctx->elen = sVar1;
  ctx->show = '\0';
  ctx->olen = 0;
  ctx->rbuf[0] = '\0';
  ctx->rbuf[1] = '\0';
  ctx->rbuf[2] = '\0';
  ctx->rbuf[3] = '\0';
  ctx->rbuf[4] = '\0';
  ctx->rbuf[5] = '\0';
  ctx->rbuf[6] = '\0';
  ctx->rbuf[7] = '\0';
  ctx->rbuf[8] = '\0';
  ctx->rbuf[9] = '\0';
  ctx->rbuf[10] = '\0';
  ctx->rbuf[0xb] = '\0';
  ctx->rbuf[0xc] = '\0';
  ctx->rbuf[0xd] = '\0';
  ctx->rbuf[0xe] = '\0';
  ctx->rbuf[0xf] = '\0';
  ctx->rbuf[0x10] = '\0';
  ctx->rbuf[0x11] = '\0';
  ctx->rbuf[0x12] = '\0';
  ctx->rbuf[0x13] = '\0';
  ctx->rbuf[0x14] = '\0';
  ctx->rbuf[0x15] = '\0';
  ctx->rbuf[0x16] = '\0';
  ctx->rbuf[0x17] = '\0';
  ctx->rbuf[0x18] = '\0';
  ctx->rbuf[0x19] = '\0';
  ctx->rbuf[0x1a] = '\0';
  ctx->rbuf[0x1b] = '\0';
  ctx->rbuf[0x1c] = '\0';
  ctx->rbuf[0x1d] = '\0';
  ctx->rbuf[0x1e] = '\0';
  ctx->rbuf[0x1f] = '\0';
  ctx->rbuf[0x20] = '\0';
  ctx->rbuf[0x21] = '\0';
  ctx->rbuf[0x22] = '\0';
  ctx->rbuf[0x23] = '\0';
  ctx->rbuf[0x24] = '\0';
  ctx->rbuf[0x25] = '\0';
  ctx->rbuf[0x26] = '\0';
  ctx->rbuf[0x27] = '\0';
  return;
}

Assistant:

void inithelpscan(struct scan_ctx *ctx,
                  const char *trigger,
                  const char *arg,
                  const char *endarg)
{
  ctx->trigger = trigger;
  ctx->tlen = strlen(trigger);
  ctx->arg = arg;
  ctx->flen = strlen(arg);
  ctx->endarg = endarg;
  ctx->elen = strlen(endarg);
  DEBUGASSERT((ctx->elen < sizeof(ctx->rbuf)) ||
              (ctx->flen < sizeof(ctx->rbuf)));
  ctx->show = 0;
  ctx->olen = 0;
  memset(ctx->rbuf, 0, sizeof(ctx->rbuf));
}